

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3RowSetTest(RowSet *pRowSet,int iBatch,sqlite3_int64 iRowid)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  RowSetEntry **ppRVar3;
  long lVar4;
  RowSetEntry *pAux;
  RowSetEntry *pTail;
  undefined4 in_stack_ffffffffffffffb8;
  RowSetEntry *local_40;
  RowSetEntry *local_38;
  
  if (pRowSet->iBatch != iBatch) {
    pRVar1 = pRowSet->pEntry;
    if (pRVar1 != (RowSetEntry *)0x0) {
      ppRVar3 = &pRowSet->pForest;
      if ((pRowSet->rsFlags & 1) == 0) {
        pRVar1 = rowSetEntrySort(pRVar1);
      }
      while( true ) {
        pRVar2 = *ppRVar3;
        if (pRVar2 == (RowSetEntry *)0x0) break;
        ppRVar3 = &pRVar2->pRight;
        if (pRVar2->pLeft == (RowSetEntry *)0x0) {
          pRVar1 = rowSetListToTree((RowSetEntry *)CONCAT44(iBatch,in_stack_ffffffffffffffb8));
          pRVar2->pLeft = pRVar1;
          break;
        }
        rowSetTreeToList(pRVar2->pLeft,&local_40,&local_38);
        pRVar2->pLeft = (RowSetEntry *)0x0;
        pRVar1 = rowSetEntryMerge(local_40,pRVar1);
      }
      if (pRVar2 == (RowSetEntry *)0x0) {
        pRVar1 = rowSetEntryAlloc(pRowSet);
        *ppRVar3 = pRVar1;
        if (pRVar1 != (RowSetEntry *)0x0) {
          pRVar1->v = 0;
          pRVar1->pRight = (RowSetEntry *)0x0;
          pRVar2 = rowSetListToTree((RowSetEntry *)CONCAT44(iBatch,in_stack_ffffffffffffffb8));
          pRVar1->pLeft = pRVar2;
        }
      }
      pRowSet->pEntry = (RowSetEntry *)0x0;
      pRowSet->pLast = (RowSetEntry *)0x0;
      *(byte *)&pRowSet->rsFlags = (byte)pRowSet->rsFlags | 1;
    }
    pRowSet->iBatch = iBatch;
  }
  pRVar1 = pRowSet->pForest;
  do {
    if (pRVar1 == (RowSetEntry *)0x0) {
      return 0;
    }
    for (pRVar2 = pRVar1->pLeft; pRVar2 != (RowSetEntry *)0x0;
        pRVar2 = *(RowSetEntry **)((long)&pRVar2->v + lVar4)) {
      lVar4 = 8;
      if ((iRowid <= pRVar2->v) && (lVar4 = 0x10, pRVar2->v <= iRowid)) {
        return 1;
      }
    }
    pRVar1 = pRVar1->pRight;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetTest(RowSet *pRowSet, int iBatch, sqlite3_int64 iRowid){
  struct RowSetEntry *p, *pTree;

  /* This routine is never called after sqlite3RowSetNext() */
  assert( pRowSet!=0 && (pRowSet->rsFlags & ROWSET_NEXT)==0 );

  /* Sort entries into the forest on the first test of a new batch.
  ** To save unnecessary work, only do this when the batch number changes.
  */
  if( iBatch!=pRowSet->iBatch ){  /*OPTIMIZATION-IF-FALSE*/
    p = pRowSet->pEntry;
    if( p ){
      struct RowSetEntry **ppPrevTree = &pRowSet->pForest;
      if( (pRowSet->rsFlags & ROWSET_SORTED)==0 ){ /*OPTIMIZATION-IF-FALSE*/
        /* Only sort the current set of entries if they need it */
        p = rowSetEntrySort(p);
      }
      for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
        ppPrevTree = &pTree->pRight;
        if( pTree->pLeft==0 ){
          pTree->pLeft = rowSetListToTree(p);
          break;
        }else{
          struct RowSetEntry *pAux, *pTail;
          rowSetTreeToList(pTree->pLeft, &pAux, &pTail);
          pTree->pLeft = 0;
          p = rowSetEntryMerge(pAux, p);
        }
      }
      if( pTree==0 ){
        *ppPrevTree = pTree = rowSetEntryAlloc(pRowSet);
        if( pTree ){
          pTree->v = 0;
          pTree->pRight = 0;
          pTree->pLeft = rowSetListToTree(p);
        }
      }
      pRowSet->pEntry = 0;
      pRowSet->pLast = 0;
      pRowSet->rsFlags |= ROWSET_SORTED;
    }
    pRowSet->iBatch = iBatch;
  }

  /* Test to see if the iRowid value appears anywhere in the forest.
  ** Return 1 if it does and 0 if not.
  */
  for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
    p = pTree->pLeft;
    while( p ){
      if( p->v<iRowid ){
        p = p->pRight;
      }else if( p->v>iRowid ){
        p = p->pLeft;
      }else{
        return 1;
      }
    }
  }
  return 0;
}